

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

void Abc_NtkDress2(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  void **__ptr;
  void *__ptr_00;
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vRes;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vRes = Abc_NtkDressComputeEquivs(pNtk1,pNtk2,nConflictLimit,fVerbose);
  iVar1 = pNtk1->nObjCounts[7];
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_NtkDressPrintStats(vRes,iVar1,iVar1,lVar3 + lVar4);
  Abc_NtkDress2Transfer(pNtk1,pNtk2,vRes,fVerbose);
  iVar1 = vRes->nSize;
  __ptr = vRes->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_002acfd6;
  }
  else {
    lVar4 = 0;
    do {
      __ptr_00 = __ptr[lVar4];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  free(__ptr);
LAB_002acfd6:
  free(vRes);
  return;
}

Assistant:

void Abc_NtkDress2( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Vec_Ptr_t * vRes;
    abctime clk = Abc_Clock();
    vRes = Abc_NtkDressComputeEquivs( pNtk1, pNtk2, nConflictLimit, fVerbose );
//    Abc_NtkDressPrintEquivs( vRes );
    Abc_NtkDressPrintStats( vRes, Abc_NtkNodeNum(pNtk1), Abc_NtkNodeNum(pNtk1), Abc_Clock() - clk );
    Abc_NtkDress2Transfer( pNtk1, pNtk2, vRes, fVerbose );
    Vec_VecFree( (Vec_Vec_t *)vRes );
}